

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void resizeResolveLabel(Parse *p,Vdbe *v,int j)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  
  iVar1 = p->nLabel;
  uVar3 = 10 - (long)iVar1;
  piVar2 = (int *)sqlite3DbReallocOrFree(p->db,p->aLabel,uVar3 * 4);
  p->aLabel = piVar2;
  if (piVar2 == (int *)0x0) {
    p->nLabelAlloc = 0;
  }
  else {
    if ((iVar1 < -0x59) && (p->nLabelAlloc / 100 < (int)((uVar3 & 0xffffffff) / 100))) {
      sqlite3ProgressCheck(p);
      piVar2 = p->aLabel;
    }
    p->nLabelAlloc = (int)uVar3;
    piVar2[j] = v->nOp;
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void resizeResolveLabel(Parse *p, Vdbe *v, int j){
  int nNewSize = 10 - p->nLabel;
  p->aLabel = sqlite3DbReallocOrFree(p->db, p->aLabel,
                     nNewSize*sizeof(p->aLabel[0]));
  if( p->aLabel==0 ){
    p->nLabelAlloc = 0;
  }else{
#ifdef SQLITE_DEBUG
    int i;
    for(i=p->nLabelAlloc; i<nNewSize; i++) p->aLabel[i] = -1;
#endif
    if( nNewSize>=100 && (nNewSize/100)>(p->nLabelAlloc/100) ){
      sqlite3ProgressCheck(p);
    }
    p->nLabelAlloc = nNewSize;
    p->aLabel[j] = v->nOp;
  }
}